

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TracyOpenGL.hpp
# Opt level: O2

void __thiscall tracy::GpuCtx::Collect(GpuCtx *this)

{
  uint uVar1;
  ulong uVar2;
  Block *pBVar3;
  uint uVar4;
  ExplicitProducer *pEVar5;
  ExplicitProducer *extraout_RAX;
  ExplicitProducer *extraout_RAX_00;
  ExplicitProducer *pEVar6;
  ulong uVar7;
  ulong uVar8;
  GLint available;
  uint64_t time;
  int local_3c;
  undefined8 local_38;
  
  pEVar5 = GetToken();
  uVar2 = (pEVar5->super_ProducerBase).tailIndex.super___atomic_base<unsigned_long>._M_i;
  pEVar6 = pEVar5;
  if ((uVar2 & 0xffff) == 0) {
    moodycamel::ConcurrentQueue<tracy::QueueItem,_tracy::moodycamel::ConcurrentQueueDefaultTraits>::
    ExplicitProducer::enqueue_begin_alloc(pEVar5,uVar2);
    pEVar6 = extraout_RAX;
  }
  pBVar3 = (pEVar5->super_ProducerBase).tailBlock;
  uVar7 = (ulong)(uint)((int)(uVar2 & 0xffff) << 5);
  (pBVar3->field_0).elements[uVar7] = '\x0f';
  uVar8 = rdtsc();
  *(ulong *)((long)&pBVar3->field_0 + uVar7 + 1) =
       (uVar8 & 0xffffffff00000000) + CONCAT44((int)((ulong)pEVar6 >> 0x20),(int)uVar8);
  *(SourceLocationData **)((long)&pBVar3->field_0 + uVar7 + 9) =
       &Collect::__tracy_source_location144;
  (pEVar5->super_ProducerBase).tailIndex.super___atomic_base<unsigned_long>._M_i = uVar2 + 1;
  uVar1 = this->m_head;
  uVar4 = this->m_tail;
  if (uVar4 != uVar1) {
    while (uVar4 != uVar1) {
      (*gl3wProcs.ptr[0xf9])((ulong)this->m_query[uVar4],0x8867,&local_3c);
      if (local_3c == 0) break;
      (*gl3wProcs.ptr[0xfa])((ulong)this->m_query[this->m_tail],0x8866,&local_38);
      pEVar6 = GetToken();
      uVar2 = (pEVar6->super_ProducerBase).tailIndex.super___atomic_base<unsigned_long>._M_i;
      if ((uVar2 & 0xffff) == 0) {
        moodycamel::
        ConcurrentQueue<tracy::QueueItem,_tracy::moodycamel::ConcurrentQueueDefaultTraits>::
        ExplicitProducer::enqueue_begin_alloc(pEVar6,uVar2);
      }
      pBVar3 = (pEVar6->super_ProducerBase).tailBlock;
      uVar8 = (ulong)(uint)((int)(uVar2 & 0xffff) << 5);
      (pBVar3->field_0).elements[uVar8] = '.';
      *(undefined8 *)((long)&pBVar3->field_0 + uVar8 + 1) = local_38;
      *(short *)((long)&pBVar3->field_0 + uVar8 + 9) = (short)this->m_tail;
      (pBVar3->field_0).elements[uVar8 + 0xb] = this->m_context;
      (pEVar6->super_ProducerBase).tailIndex.super___atomic_base<unsigned_long>._M_i = uVar2 + 1;
      uVar4 = this->m_tail + 1 & 0xffff;
      this->m_tail = uVar4;
      uVar1 = this->m_head;
    }
  }
  pEVar5 = GetToken();
  uVar2 = (pEVar5->super_ProducerBase).tailIndex.super___atomic_base<unsigned_long>._M_i;
  pEVar6 = pEVar5;
  if ((uVar2 & 0xffff) == 0) {
    moodycamel::ConcurrentQueue<tracy::QueueItem,_tracy::moodycamel::ConcurrentQueueDefaultTraits>::
    ExplicitProducer::enqueue_begin_alloc(pEVar5,uVar2);
    pEVar6 = extraout_RAX_00;
  }
  pBVar3 = (pEVar5->super_ProducerBase).tailBlock;
  uVar7 = (ulong)(uint)((int)(uVar2 & 0xffff) << 5);
  (pBVar3->field_0).elements[uVar7] = '\x11';
  uVar8 = rdtsc();
  *(ulong *)((long)&pBVar3->field_0 + uVar7 + 1) =
       (uVar8 & 0xffffffff00000000) + CONCAT44((int)((ulong)pEVar6 >> 0x20),(int)uVar8);
  (pEVar5->super_ProducerBase).tailIndex.super___atomic_base<unsigned_long>._M_i = uVar2 + 1;
  return;
}

Assistant:

void Collect()
    {
        ZoneScopedC( Color::Red4 );

        if( m_tail == m_head ) return;

#ifdef TRACY_ON_DEMAND
        if( !GetProfiler().IsConnected() )
        {
            m_head = m_tail = 0;
            return;
        }
#endif

        while( m_tail != m_head )
        {
            GLint available;
            glGetQueryObjectiv( m_query[m_tail], GL_QUERY_RESULT_AVAILABLE, &available );
            if( !available ) return;

            uint64_t time;
            glGetQueryObjectui64v( m_query[m_tail], GL_QUERY_RESULT, &time );

            TracyLfqPrepare( QueueType::GpuTime );
            MemWrite( &item->gpuTime.gpuTime, (int64_t)time );
            MemWrite( &item->gpuTime.queryId, (uint16_t)m_tail );
            MemWrite( &item->gpuTime.context, m_context );
            TracyLfqCommit;

            m_tail = ( m_tail + 1 ) % QueryCount;
        }
    }